

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O1

void __thiscall
UIDisplayer::drawParagraphAtCoords
          (UIDisplayer *this,Vec2d coords,string *textToDisplay,GLfloat pixelSize,Colour *colour,
          bool rotateColours)

{
  GLfloat *pGVar1;
  float fVar2;
  Vec2d local_40;
  Vec2d coords_local;
  
  local_40 = coords;
  coords_local.x = pixelSize;
  glPushMatrix();
  coords_local.y = Vec2d::getX(&local_40);
  fVar2 = Vec2d::getY(&local_40);
  glTranslatef(coords_local.y,fVar2,0);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  TextDisplayer::writeText(this->textDisplayer,textToDisplay,(int)coords_local.x,rotateColours);
  glPopMatrix();
  return;
}

Assistant:

void UIDisplayer::drawParagraphAtCoords(Vec2d coords, const string& textToDisplay, GLfloat pixelSize, Colour* colour, bool rotateColours) {
    glPushMatrix();
        glTranslatef(coords.getX(), coords.getY(), 0.f);
        glColor3fv(colour->getColour3fv());
        textDisplayer->writeText(textToDisplay, pixelSize, rotateColours);
    glPopMatrix();
}